

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O0

void __thiscall
QPDFAcroFormDocumentHelper::setFormFieldName
          (QPDFAcroFormDocumentHelper *this,QPDFFormFieldObjectHelper *ff,string *name)

{
  allocator<char> local_d9;
  string local_d8 [32];
  QPDFObjectHandle local_b8;
  QPDFObjectHandle local_a8;
  undefined1 local_98 [8];
  QPDFObjectHandle ff_oh;
  set visited;
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *name_local;
  QPDFFormFieldObjectHelper *ff_local;
  QPDFAcroFormDocumentHelper *this_local;
  
  local_20 = name;
  name_local = (string *)ff;
  ff_local = (QPDFFormFieldObjectHelper *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"/T",&local_41);
  QPDFFormFieldObjectHelper::setFieldAttribute(ff,&local_40,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  QPDFObjGen::set::set
            ((set *)&ff_oh.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)local_98);
  QPDFObjectHandle::QPDFObjectHandle(&local_a8,(QPDFObjectHandle *)local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"/Parent",&local_d9);
  QPDFObjectHandle::getKey(&local_b8,(string *)local_98);
  traverseField(this,&local_a8,&local_b8,0,
                (set *)&ff_oh.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjectHandle::~QPDFObjectHandle(&local_b8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_d9);
  QPDFObjectHandle::~QPDFObjectHandle(&local_a8);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_98);
  QPDFObjGen::set::~set
            ((set *)&ff_oh.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void
QPDFAcroFormDocumentHelper::setFormFieldName(QPDFFormFieldObjectHelper ff, std::string const& name)
{
    ff.setFieldAttribute("/T", name);
    QPDFObjGen::set visited;
    auto ff_oh = ff.getObjectHandle();
    traverseField(ff_oh, ff_oh.getKey("/Parent"), 0, visited);
}